

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

bool __thiscall
cmComputeLinkInformation::CheckSharedLibNoSOName(cmComputeLinkInformation *this,string *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  string soname;
  string file;
  string local_60;
  string local_40;
  
  cmsys::SystemTools::GetFilenameName(&local_40,item);
  bVar2 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,local_40._M_dataplus._M_p);
  if (bVar2) {
    paVar1 = &local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = cmSystemTools::GuessLibrarySOName(item,&local_60);
    if (bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      AddSharedLibNoSOName(this,item);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = true;
      if (!bVar2) goto LAB_003a535c;
    }
  }
  bVar3 = false;
LAB_003a535c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmComputeLinkInformation::CheckSharedLibNoSOName(std::string const& item)
{
  // This platform will use the path to a library as its soname if the
  // library is given via path and was not built with an soname.  If
  // this is a shared library that might be the case.
  std::string file = cmSystemTools::GetFilenameName(item);
  if(this->ExtractSharedLibraryName.find(file))
    {
    // If we can guess the soname fairly reliably then assume the
    // library has one.  Otherwise assume the library has no builtin
    // soname.
    std::string soname;
    if(!cmSystemTools::GuessLibrarySOName(item, soname))
      {
      this->AddSharedLibNoSOName(item);
      return true;
      }
    }
  return false;
}